

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFormatTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::Texture3DFormatCase::iterate(Texture3DFormatCase *this)

{
  TestContext *this_00;
  bool bVar1;
  int iVar2;
  
  bVar1 = testSlice(this,this->m_curSlice);
  if ((!bVar1) &&
     (this_00 = (this->super_TestCase).super_TestNode.m_testCtx,
     this_00->m_testResult == QP_TEST_RESULT_PASS)) {
    tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_FAIL,"Image comparison failed");
  }
  iVar2 = this->m_curSlice + 1;
  this->m_curSlice = iVar2;
  return (IterateResult)(iVar2 < (this->m_texture->m_refTexture).m_depth);
}

Assistant:

Texture3DFormatCase::IterateResult Texture3DFormatCase::iterate (void)
{
	// Execute test for all slices.
	bool isOk = testSlice(m_curSlice);

	if (!isOk && m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");

	m_curSlice += 1;

	return m_curSlice < m_texture->getRefTexture().getDepth() ? CONTINUE : STOP;
}